

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

xmlRefPtr xmlAddRef(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlChar *value,xmlAttrPtr attr)

{
  int iVar1;
  xmlHashTablePtr hash;
  xmlRefPtr data;
  xmlChar *pxVar2;
  xmlAttrPtr pxVar3;
  long lVar4;
  xmlListPtr l;
  
  if (attr == (xmlAttrPtr)0x0 || (value == (xmlChar *)0x0 || doc == (xmlDocPtr)0x0)) {
    return (xmlRefPtr)0x0;
  }
  hash = (xmlHashTablePtr)doc->refs;
  if (hash == (xmlHashTablePtr)0x0) {
    data = (xmlRefPtr)0x0;
    hash = xmlHashCreateDict(0,doc->dict);
    doc->refs = hash;
    if (hash == (xmlHashTablePtr)0x0) goto LAB_0015516d;
  }
  data = (xmlRefPtr)(*xmlMalloc)(0x28);
  if (data == (xmlRefPtr)0x0) {
    data = (xmlRefPtr)0x0;
  }
  else {
    data->attr = (xmlAttrPtr)0x0;
    data->name = (xmlChar *)0x0;
    data->next = (_xmlRef *)0x0;
    data->value = (xmlChar *)0x0;
    *(undefined8 *)&data->lineno = 0;
    pxVar2 = xmlStrdup(value);
    data->value = pxVar2;
    if (pxVar2 != (xmlChar *)0x0) {
      if (((ctxt == (xmlValidCtxtPtr)0x0) || ((ctxt->flags & 2) == 0)) ||
         (*(int *)((long)ctxt->userData + 0x2b0) != 5)) {
        data->name = (xmlChar *)0x0;
        pxVar3 = attr;
      }
      else {
        pxVar2 = xmlStrdup(attr->name);
        data->name = pxVar2;
        if (pxVar2 == (xmlChar *)0x0) goto LAB_0015516d;
        pxVar3 = (xmlAttrPtr)0x0;
      }
      data->attr = pxVar3;
      lVar4 = xmlGetLineNo(attr->parent);
      data->lineno = (int)lVar4;
      l = (xmlListPtr)xmlHashLookup(hash,value);
      if (l == (xmlListPtr)0x0) {
        l = xmlListCreate(xmlFreeRef,xmlDummyCompare);
        if (l == (xmlListPtr)0x0) goto LAB_0015516d;
        iVar1 = xmlHashAdd(hash,value,l);
        if (iVar1 < 1) {
          xmlListDelete(l);
          goto LAB_0015516d;
        }
      }
      iVar1 = xmlListAppend(l,data);
      if (iVar1 == 0) {
        return data;
      }
    }
  }
LAB_0015516d:
  xmlVErrMemory(ctxt);
  if (data != (xmlRefPtr)0x0) {
    if (data->value != (xmlChar *)0x0) {
      (*xmlFree)(data->value);
    }
    if (data->name != (xmlChar *)0x0) {
      (*xmlFree)(data->name);
    }
    (*xmlFree)(data);
  }
  return (xmlRefPtr)0x0;
}

Assistant:

xmlRefPtr
xmlAddRef(xmlValidCtxtPtr ctxt, xmlDocPtr doc, const xmlChar *value,
    xmlAttrPtr attr) {
    xmlRefPtr ret = NULL;
    xmlRefTablePtr table;
    xmlListPtr ref_list;

    if (doc == NULL) {
        return(NULL);
    }
    if (value == NULL) {
        return(NULL);
    }
    if (attr == NULL) {
        return(NULL);
    }

    /*
     * Create the Ref table if needed.
     */
    table = (xmlRefTablePtr) doc->refs;
    if (table == NULL) {
        doc->refs = table = xmlHashCreateDict(0, doc->dict);
        if (table == NULL)
            goto failed;
    }

    ret = (xmlRefPtr) xmlMalloc(sizeof(xmlRef));
    if (ret == NULL)
        goto failed;
    memset(ret, 0, sizeof(*ret));

    /*
     * fill the structure.
     */
    ret->value = xmlStrdup(value);
    if (ret->value == NULL)
        goto failed;
    if (xmlIsStreaming(ctxt)) {
	/*
	 * Operating in streaming mode, attr is gonna disappear
	 */
	ret->name = xmlStrdup(attr->name);
        if (ret->name == NULL)
            goto failed;
	ret->attr = NULL;
    } else {
	ret->name = NULL;
	ret->attr = attr;
    }
    ret->lineno = xmlGetLineNo(attr->parent);

    /* To add a reference :-
     * References are maintained as a list of references,
     * Lookup the entry, if no entry create new nodelist
     * Add the owning node to the NodeList
     * Return the ref
     */

    ref_list = xmlHashLookup(table, value);
    if (ref_list == NULL) {
        int res;

        ref_list = xmlListCreate(xmlFreeRef, xmlDummyCompare);
        if (ref_list == NULL)
	    goto failed;
        res = xmlHashAdd(table, value, ref_list);
        if (res <= 0) {
            xmlListDelete(ref_list);
	    goto failed;
        }
    }
    if (xmlListAppend(ref_list, ret) != 0)
        goto failed;
    return(ret);

failed:
    xmlVErrMemory(ctxt);
    if (ret != NULL) {
        if (ret->value != NULL)
	    xmlFree((char *)ret->value);
        if (ret->name != NULL)
	    xmlFree((char *)ret->name);
        xmlFree(ret);
    }
    return(NULL);
}